

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  ProgressData *bar;
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  size_t __n;
  double dVar11;
  timeval newer;
  char format [40];
  char line [401];
  
  newer = tvnow();
  lVar2 = *(long *)((long)clientp + 0xb8);
  bar = (ProgressData *)((long)clientp + 0x88);
  if (lVar2 < 0) {
    lVar10 = ultotal + dltotal;
    lVar4 = ulnow + dlnow;
    if (ultotal == 0 && dltotal == 0) {
      lVar10 = 0x7fffffffffffffff;
      lVar4 = 0x7fffffffffffffff;
    }
  }
  else {
    lVar10 = lVar2 + ultotal + dltotal;
    if (0x7fffffffffffffff - lVar2 < ultotal + dltotal) {
      lVar10 = 0x7fffffffffffffff;
    }
    lVar4 = lVar2 + ulnow + dlnow;
    if (0x7fffffffffffffff - lVar2 < ulnow + dlnow) {
      lVar4 = 0x7fffffffffffffff;
    }
  }
  lVar2 = *(long *)((long)clientp + 0x10);
  if (bar->calls != 0) {
    if (lVar10 == 0) {
      lVar5 = tvdiff(newer,*(timeval *)((long)clientp + 0x98));
      if (lVar5 < 100) {
        return 0;
      }
      update_width(bar);
      lVar5 = *(long *)((long)clientp + 0x90);
      iVar8 = *(int *)((long)clientp + 0xa8);
      line[0] = '\r';
      memset(line + 1,0x20,(long)iVar8);
      line[(long)iVar8 + 1] = '\0';
      builtin_strncpy(line + (long)*(int *)((long)clientp + 0xc4) + 1,"-=O=-",5);
      uVar1 = *(uint *)((long)clientp + 0xc0);
      iVar9 = 0;
      iVar8 = (int)(1000000 / (long)(iVar8 + -2));
      line[(long)(sinus[(ulong)uVar1 % 200] / iVar8) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 5) % 200] / iVar8) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 10) % 200] / iVar8) + 1] = '#';
      line[(long)(sinus[(ulong)(uVar1 + 0xf) % 200] / iVar8) + 1] = '#';
      fputs(line,*(FILE **)((long)clientp + 0xb0));
      uVar1 = *(int *)((long)clientp + 0xc0) + 2;
      uVar3 = *(int *)((long)clientp + 0xc0) - 0xc6;
      if (uVar1 < 200) {
        uVar3 = uVar1;
      }
      *(uint *)((long)clientp + 0xc0) = uVar3;
      if (lVar4 != lVar5) {
        iVar9 = *(int *)((long)clientp + 200);
      }
      iVar9 = iVar9 + *(int *)((long)clientp + 0xc4);
      *(int *)((long)clientp + 0xc4) = iVar9;
      iVar8 = *(int *)((long)clientp + 0xa8) + -6;
      if (iVar9 < iVar8) {
        if (-1 < iVar9) goto LAB_0010bbcd;
        iVar8 = 0;
        uVar7 = 1;
      }
      else {
        uVar7 = 0xffffffff;
      }
      *(undefined4 *)((long)clientp + 200) = uVar7;
      *(int *)((long)clientp + 0xc4) = iVar8;
    }
    else {
      if (*(long *)((long)clientp + 0x90) == lVar4) {
        return 0;
      }
      lVar5 = tvdiff(newer,*(timeval *)((long)clientp + 0x98));
      if ((lVar5 < 100) && (lVar4 < lVar10)) {
        return 0;
      }
    }
  }
LAB_0010bbcd:
  bar->calls = bar->calls + 1;
  update_width(bar);
  if ((0 < lVar10) && (lVar4 != *(long *)((long)clientp + 0x90))) {
    if (lVar10 < lVar4) {
      lVar10 = lVar4;
    }
    iVar8 = *(int *)((long)clientp + 0xa8) + -7;
    dVar11 = (double)iVar8 * ((double)lVar4 / (double)lVar10);
    uVar6 = (ulong)dVar11;
    __n = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
    if (399 < __n) {
      __n = 400;
    }
    memset(line,0x23,__n);
    line[__n] = '\0';
    curl_msnprintf(format,0x28,"\r%%-%ds %%5.1f%%%%",iVar8);
    curl_mfprintf(((double)lVar4 / (double)lVar10) * 100.0,*(undefined8 *)((long)clientp + 0xb0),
                  format,line);
  }
  fflush(*(FILE **)((long)clientp + 0xb0));
  *(long *)((long)clientp + 0x90) = lVar4;
  *(timeval *)((long)clientp + 0x98) = newer;
  if (*(char *)(lVar2 + 0x342) == '\x01') {
    *(undefined1 *)(lVar2 + 0x342) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x20),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  struct timeval now = tvnow();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      total = dltotal + ultotal;
    else
      total = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0) {
    if(dltotal || ultotal)
      point = dlnow + ulnow;
    else
      point = CURL_OFF_T_MAX;
  }
  else if((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress did not change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we are at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      update_width(bar);
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  update_width(bar);
  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    size_t num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (size_t) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
    fprintf(bar->out, format, line, percent);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}